

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

void Imath_3_2::jacobiSVD<double>
               (Matrix44<double> *A,Matrix44<double> *U,Vec4<double> *S,Matrix44<double> *V,
               double tol,bool forcePositiveDeterminant)

{
  Matrix44<double> *in_RDI;
  byte in_R8B;
  bool in_stack_0000006f;
  double in_stack_00000070;
  Matrix44<double> *in_stack_00000078;
  Vec4<double> *in_stack_00000080;
  undefined7 in_stack_00000088;
  Matrix44<double> local_b0;
  byte local_29;
  
  local_29 = in_R8B & 1;
  Matrix44<double>::Matrix44(&local_b0,in_RDI);
  anon_unknown_20::twoSidedJacobiSVD<double>
            ((Matrix44<double> *)tol,
             (Matrix44<double> *)CONCAT17(forcePositiveDeterminant,in_stack_00000088),
             in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_0000006f);
  return;
}

Assistant:

void
jacobiSVD (
    const IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A,
    IMATH_INTERNAL_NAMESPACE::Matrix44<T>&       U,
    IMATH_INTERNAL_NAMESPACE::Vec4<T>&           S,
    IMATH_INTERNAL_NAMESPACE::Matrix44<T>&       V,
    const T                                      tol,
    const bool                                   forcePositiveDeterminant)
{
    twoSidedJacobiSVD (A, U, S, V, tol, forcePositiveDeterminant);
}